

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

interval_t __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,duckdb::interval_t,duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>,duckdb::QuantileIndirect<duckdb::dtime_t>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>
          *accessor)

{
  bool bVar1;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>_>
  __comp;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>_>
  __comp_00;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>_>
  __comp_01;
  interval_t input;
  interval_t input_00;
  RESULT_TYPE RVar2;
  interval_t iVar3;
  interval_t hi;
  interval_t lo;
  undefined7 uStack_7f;
  undefined7 uStack_67;
  undefined7 uStack_4f;
  interval_t local_48;
  interval_t local_38;
  
  bVar1 = this->desc;
  if (this->CRN == this->FRN) {
    __comp._17_7_ = uStack_4f;
    __comp.desc = bVar1;
    __comp.accessor_r = accessor;
    __comp.accessor_l = accessor;
    std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>,duckdb::QuantileIndirect<duckdb::dtime_t>>>>
              (v_t + this->begin,v_t + this->CRN,v_t + this->end,__comp);
    RVar2 = QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>
            ::operator()(accessor,v_t + this->FRN);
    input.micros = RVar2.micros;
    input.months = (int)input.micros;
    input.days = (int)((ulong)input.micros >> 0x20);
    iVar3 = Cast::Operation<duckdb::interval_t,duckdb::interval_t>(RVar2._0_8_,input);
    return iVar3;
  }
  __comp_00._17_7_ = uStack_67;
  __comp_00.desc = bVar1;
  __comp_00.accessor_r = accessor;
  __comp_00.accessor_l = accessor;
  std::
  nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>,duckdb::QuantileIndirect<duckdb::dtime_t>>>>
            (v_t + this->begin,v_t + this->FRN,v_t + this->end,__comp_00);
  __comp_01._17_7_ = uStack_7f;
  __comp_01.desc = bVar1;
  __comp_01.accessor_r = accessor;
  __comp_01.accessor_l = accessor;
  std::
  nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>,duckdb::QuantileIndirect<duckdb::dtime_t>>>>
            (v_t + this->FRN,v_t + this->CRN,v_t + this->end,__comp_01);
  RVar2 = QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>
          ::operator()(accessor,v_t + this->FRN);
  iVar3.micros = RVar2.micros;
  iVar3.months = (int)iVar3.micros;
  iVar3.days = (int)((ulong)iVar3.micros >> 0x20);
  local_38 = Cast::Operation<duckdb::interval_t,duckdb::interval_t>(RVar2._0_8_,iVar3);
  RVar2 = QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>
          ::operator()(accessor,v_t + this->CRN);
  input_00.micros = RVar2.micros;
  input_00.months = (int)input_00.micros;
  input_00.days = (int)((ulong)input_00.micros >> 0x20);
  local_48 = Cast::Operation<duckdb::interval_t,duckdb::interval_t>(RVar2._0_8_,input_00);
  iVar3 = CastInterpolation::Interpolate<duckdb::interval_t>
                    (&local_38,
                     this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),&local_48);
  return iVar3;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}